

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipField(ParserImpl *this)

{
  string *__lhs;
  bool bVar1;
  __type _Var2;
  string field_name;
  allocator<char> local_82;
  allocator<char> local_81;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"[",(allocator<char> *)&local_60);
  bVar1 = TryConsume(this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (bVar1) {
    bVar1 = ConsumeTypeUrlOrFullTypeName(this,&local_40);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"]",(allocator<char> *)&local_60);
      bVar1 = ConsumeBeforeWhitespace(this,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      if (bVar1) goto LAB_002b0da7;
    }
  }
  else {
    bVar1 = ConsumeIdentifierBeforeWhitespace(this,&local_40);
    if (bVar1) {
LAB_002b0da7:
      TryConsumeWhitespace(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,":",(allocator<char> *)&local_60);
      bVar1 = TryConsumeBeforeWhitespace(this,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      if (bVar1) {
        TryConsumeWhitespace(this);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"{",&local_81);
        __lhs = &(this->tokenizer_).current_.text;
        _Var2 = std::operator==(__lhs,&local_80);
        if (_Var2) {
          std::__cxx11::string::~string((string *)&local_80);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"<",&local_82);
          _Var2 = std::operator==(__lhs,&local_60);
          std::__cxx11::string::~string((string *)&local_60);
          std::__cxx11::string::~string((string *)&local_80);
          if (!_Var2) {
            bVar1 = SkipFieldValue(this);
            goto LAB_002b0e7d;
          }
        }
        bVar1 = SkipFieldMessage(this);
      }
      else {
        bVar1 = SkipFieldMessage(this);
      }
LAB_002b0e7d:
      if (bVar1 != false) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,";",&local_81);
        bVar1 = TryConsume(this,&local_80);
        if (!bVar1) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,",",&local_82);
          TryConsume(this,&local_60);
          std::__cxx11::string::~string((string *)&local_60);
        }
        std::__cxx11::string::~string((string *)&local_80);
        bVar1 = true;
        goto LAB_002b0ee5;
      }
    }
  }
  bVar1 = false;
LAB_002b0ee5:
  std::__cxx11::string::~string((string *)&local_40);
  return bVar1;
}

Assistant:

bool SkipField() {
    std::string field_name;
    if (TryConsume("[")) {
      // Extension name or type URL.
      DO(ConsumeTypeUrlOrFullTypeName(&field_name));
      DO(ConsumeBeforeWhitespace("]"));
    } else {
      DO(ConsumeIdentifierBeforeWhitespace(&field_name));
    }
    TryConsumeWhitespace();

    // Try to guess the type of this field.
    // If this field is not a message, there should be a ":" between the
    // field name and the field value and also the field value should not
    // start with "{" or "<" which indicates the beginning of a message body.
    // If there is no ":" or there is a "{" or "<" after ":", this field has
    // to be a message or the input is ill-formed.
    if (TryConsumeBeforeWhitespace(":")) {
      TryConsumeWhitespace();
      if (!LookingAt("{") && !LookingAt("<")) {
        DO(SkipFieldValue());
      } else {
        DO(SkipFieldMessage());
      }
    } else {
      DO(SkipFieldMessage());
    }
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");
    return true;
  }